

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

void gguf_set_kv(gguf_context *ctx,gguf_context *src)

{
  gguf_kv *this;
  gguf_type type;
  pointer pgVar1;
  char *pcVar2;
  ulong uVar3;
  size_t __n;
  uchar *puVar4;
  long lVar5;
  double *pdVar6;
  unsigned_long *puVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  uint *puVar10;
  char *pcVar11;
  int *piVar12;
  unsigned_short *puVar13;
  bool *pbVar14;
  short *psVar15;
  float *pfVar16;
  long lVar17;
  size_t sVar18;
  int line;
  long lVar19;
  vector<const_char_*,_std::allocator<const_char_*>_> tmp;
  allocator_type local_49;
  vector<const_char_*,_std::allocator<const_char_*>_> local_48;
  
  uVar3 = (long)(src->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(src->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (0 < (long)uVar3) {
    lVar17 = (uVar3 >> 3) * 0x2e8ba2e8ba2e8ba3;
    lVar19 = 1;
    if (1 < lVar17) {
      lVar19 = lVar17;
    }
    lVar17 = 0;
    do {
      pgVar1 = (src->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
               super__Vector_impl_data._M_start;
      this = pgVar1 + lVar17;
      if (pgVar1[lVar17].is_array == false) {
        switch(this->type) {
        case GGUF_TYPE_UINT8:
          pcVar2 = (this->key)._M_dataplus._M_p;
          puVar4 = gguf_kv::get_val<unsigned_char>(this,0);
          gguf_set_val_u8(ctx,pcVar2,*puVar4);
          break;
        case GGUF_TYPE_INT8:
          pcVar2 = (this->key)._M_dataplus._M_p;
          pcVar11 = gguf_kv::get_val<signed_char>(this,0);
          gguf_set_val_i8(ctx,pcVar2,*pcVar11);
          break;
        case GGUF_TYPE_UINT16:
          pcVar2 = (this->key)._M_dataplus._M_p;
          puVar13 = gguf_kv::get_val<unsigned_short>(this,0);
          gguf_set_val_u16(ctx,pcVar2,*puVar13);
          break;
        case GGUF_TYPE_INT16:
          pcVar2 = (this->key)._M_dataplus._M_p;
          psVar15 = gguf_kv::get_val<short>(this,0);
          gguf_set_val_i16(ctx,pcVar2,*psVar15);
          break;
        case GGUF_TYPE_UINT32:
          pcVar2 = (this->key)._M_dataplus._M_p;
          puVar10 = gguf_kv::get_val<unsigned_int>(this,0);
          gguf_set_val_u32(ctx,pcVar2,*puVar10);
          break;
        case GGUF_TYPE_INT32:
          pcVar2 = (this->key)._M_dataplus._M_p;
          piVar12 = gguf_kv::get_val<int>(this,0);
          gguf_set_val_i32(ctx,pcVar2,*piVar12);
          break;
        case GGUF_TYPE_FLOAT32:
          pcVar2 = (this->key)._M_dataplus._M_p;
          pfVar16 = gguf_kv::get_val<float>(this,0);
          gguf_set_val_f32(ctx,pcVar2,*pfVar16);
          break;
        case GGUF_TYPE_BOOL:
          pcVar2 = (this->key)._M_dataplus._M_p;
          pbVar14 = gguf_kv::get_val<bool>(this,0);
          gguf_set_val_bool(ctx,pcVar2,*pbVar14);
          break;
        case GGUF_TYPE_STRING:
          pcVar2 = (this->key)._M_dataplus._M_p;
          pbVar9 = gguf_kv::get_val<std::__cxx11::string>(this,0);
          gguf_set_val_str(ctx,pcVar2,(pbVar9->_M_dataplus)._M_p);
          break;
        default:
          line = 0x422;
LAB_0013f0ac:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
                     ,line,"invalid type");
        case GGUF_TYPE_UINT64:
          pcVar2 = (this->key)._M_dataplus._M_p;
          puVar7 = gguf_kv::get_val<unsigned_long>(this,0);
          gguf_set_val_u64(ctx,pcVar2,*puVar7);
          break;
        case GGUF_TYPE_INT64:
          pcVar2 = (this->key)._M_dataplus._M_p;
          plVar8 = gguf_kv::get_val<long>(this,0);
          gguf_set_val_i64(ctx,pcVar2,*plVar8);
          break;
        case GGUF_TYPE_FLOAT64:
          pcVar2 = (this->key)._M_dataplus._M_p;
          pdVar6 = gguf_kv::get_val<double>(this,0);
          gguf_set_val_f64(ctx,pcVar2,*pdVar6);
        }
      }
      else {
        __n = gguf_kv::get_ne(this);
        type = this->type;
        if ((type < GGUF_TYPE_STRING) || (type - GGUF_TYPE_UINT64 < 3)) {
          gguf_set_arr_data(ctx,(this->key)._M_dataplus._M_p,type,
                            (this->data).
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start,__n);
        }
        else {
          if (type != GGUF_TYPE_STRING) {
            line = 0x43f;
            goto LAB_0013f0ac;
          }
          std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_48,__n,&local_49);
          if (__n != 0) {
            lVar5 = 0;
            sVar18 = __n;
            do {
              *(undefined8 *)
               ((long)local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar5) =
                   *(undefined8 *)
                    ((long)&(((this->data_string).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                    lVar5 * 4);
              lVar5 = lVar5 + 8;
              sVar18 = sVar18 - 1;
            } while (sVar18 != 0);
          }
          gguf_set_arr_str(ctx,(this->key)._M_dataplus._M_p,
                           local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                           _M_impl.super__Vector_impl_data._M_start,__n);
          if (local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start != (char **)0x0) {
            operator_delete(local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != lVar19);
  }
  return;
}

Assistant:

void gguf_set_kv(struct gguf_context * ctx, const struct gguf_context * src) {
    const int64_t n_kv = gguf_get_n_kv(src);
    for (int64_t i = 0; i < n_kv; ++i) {
        const struct gguf_kv & kv = src->kv[i];

        if (!kv.is_array) {
            switch (kv.get_type()) {
                case GGUF_TYPE_UINT8:   gguf_set_val_u8  (ctx, kv.get_key().c_str(), kv.get_val<uint8_t>());             break;
                case GGUF_TYPE_INT8:    gguf_set_val_i8  (ctx, kv.get_key().c_str(), kv.get_val<int8_t>());              break;
                case GGUF_TYPE_UINT16:  gguf_set_val_u16 (ctx, kv.get_key().c_str(), kv.get_val<uint16_t>());            break;
                case GGUF_TYPE_INT16:   gguf_set_val_i16 (ctx, kv.get_key().c_str(), kv.get_val<int16_t>());             break;
                case GGUF_TYPE_UINT32:  gguf_set_val_u32 (ctx, kv.get_key().c_str(), kv.get_val<uint32_t>());            break;
                case GGUF_TYPE_INT32:   gguf_set_val_i32 (ctx, kv.get_key().c_str(), kv.get_val<int32_t>());             break;
                case GGUF_TYPE_FLOAT32: gguf_set_val_f32 (ctx, kv.get_key().c_str(), kv.get_val<float>());               break;
                case GGUF_TYPE_UINT64:  gguf_set_val_u64 (ctx, kv.get_key().c_str(), kv.get_val<uint64_t>());            break;
                case GGUF_TYPE_INT64:   gguf_set_val_i64 (ctx, kv.get_key().c_str(), kv.get_val<int64_t>());             break;
                case GGUF_TYPE_FLOAT64: gguf_set_val_f64 (ctx, kv.get_key().c_str(), kv.get_val<double>());              break;
                case GGUF_TYPE_BOOL:    gguf_set_val_bool(ctx, kv.get_key().c_str(), kv.get_val<bool>());                break;
                case GGUF_TYPE_STRING:  gguf_set_val_str (ctx, kv.get_key().c_str(), kv.get_val<std::string>().c_str()); break;
                case GGUF_TYPE_ARRAY:
                default: GGML_ABORT("invalid type");
            }
            continue;
        }

        const size_t ne = kv.get_ne();

        switch (kv.get_type()) {
            case GGUF_TYPE_UINT8:
            case GGUF_TYPE_INT8:
            case GGUF_TYPE_UINT16:
            case GGUF_TYPE_INT16:
            case GGUF_TYPE_UINT32:
            case GGUF_TYPE_INT32:
            case GGUF_TYPE_FLOAT32:
            case GGUF_TYPE_UINT64:
            case GGUF_TYPE_INT64:
            case GGUF_TYPE_FLOAT64:
            case GGUF_TYPE_BOOL: {
                gguf_set_arr_data(ctx, kv.get_key().c_str(), kv.get_type(), kv.data.data(), ne);
            } break;
            case GGUF_TYPE_STRING: {
                std::vector<const char *> tmp(ne);
                for (size_t j = 0; j < ne; ++j) {
                    tmp[j] = kv.data_string[j].c_str();
                }
                gguf_set_arr_str(ctx, kv.get_key().c_str(), tmp.data(), ne);
            } break;
            case GGUF_TYPE_ARRAY:
            default: GGML_ABORT("invalid type");
        }
    }
}